

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall ByteFileWriter::writeIcbTag(ByteFileWriter *this,uint8_t fileType)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint16_t *buff16;
  uint32_t *buff32;
  uint8_t fileType_local;
  ByteFileWriter *this_local;
  
  puVar1 = this->m_curPos;
  puVar2 = this->m_curPos;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar2[4] = '\x04';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2[8] = '\x01';
  puVar2[9] = '\0';
  this->m_curPos[0xb] = fileType;
  puVar2[0x12] = ' ';
  puVar2[0x13] = '\0';
  this->m_curPos = this->m_curPos + 0x14;
  return;
}

Assistant:

void ByteFileWriter::writeIcbTag(const uint8_t fileType)
{
    const auto buff32 = reinterpret_cast<uint32_t *>(m_curPos);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_curPos);

    // icb tag
    buff32[0] = 0;  // Prior Recorded Number of Direct Entries
    buff16[2] = 4;  // Strategy Type
    buff16[3] = 0;  // Strategy parameters
    buff16[4] = 1;  // Maximum Number of Entries
    // skip reserved byte
    m_curPos[11] = fileType;  // metadata file type
    // skip 6 byte zero Parent ICB Location
    buff16[18 / 2] = 0x20;  // flags. Archive: This bit shall be set to ONE when the file is created or is written.

    m_curPos += 20;
}